

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

EmbeddingLayerParams * __thiscall
CoreML::Specification::EmbeddingLayerParams::New(EmbeddingLayerParams *this,Arena *arena)

{
  EmbeddingLayerParams *this_00;
  
  this_00 = (EmbeddingLayerParams *)operator_new(0x38);
  EmbeddingLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::EmbeddingLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

EmbeddingLayerParams* EmbeddingLayerParams::New(::google::protobuf::Arena* arena) const {
  EmbeddingLayerParams* n = new EmbeddingLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}